

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StringItoAMethod::~StringItoAMethod(StringItoAMethod *this)

{
  StringItoAMethod *this_local;
  
  ~StringItoAMethod(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

StringItoAMethod(Compilation& comp, const std::string& name, LiteralBase base) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 1, {&comp.getIntegerType()},
                               comp.getVoidType(), true, /* isFirstArgLValue */ true),
        base(base) {}